

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::Comment_PDU::operator==(Comment_PDU *this,Comment_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  pointer pKVar4;
  KBOOL KVar5;
  pointer pKVar6;
  FixedDatum **ppFVar7;
  pointer pKVar8;
  VariableDatum **ppVVar9;
  bool bVar10;
  
  KVar5 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if (((!KVar5) && (this->m_ui32NumFixedDatum == Value->m_ui32NumFixedDatum)) &&
     (this->m_ui32NumVariableDatum == Value->m_ui32NumVariableDatum)) {
    pKVar6 = (this->m_vFixedDatum).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar1 = (this->m_vFixedDatum).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar2 = (Value->m_vFixedDatum).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar1 - (long)pKVar6 ==
        (long)(Value->m_vFixedDatum).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar2) {
      if (pKVar6 != pKVar1) {
        ppFVar7 = &pKVar2->m_pRef;
        do {
          if (pKVar6->m_pRef != *ppFVar7) {
            return false;
          }
          pKVar6 = pKVar6 + 1;
          ppFVar7 = ppFVar7 + 3;
        } while (pKVar6 != pKVar1);
      }
      pKVar3 = (this->m_vVariableDatum).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pKVar4 = (this->m_vVariableDatum).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pKVar8 = (Value->m_vVariableDatum).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pKVar4 - (long)pKVar3 ==
          (long)(Value->m_vVariableDatum).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar8) {
        if (pKVar3 == pKVar4) {
          return true;
        }
        ppVVar9 = &pKVar8->m_pRef;
        do {
          pKVar8 = pKVar3 + 1;
          bVar10 = pKVar3->m_pRef == *ppVVar9;
          if (!bVar10) {
            return bVar10;
          }
          ppVVar9 = ppVVar9 + 3;
          pKVar3 = pKVar8;
        } while (pKVar8 != pKVar4);
        return bVar10;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Comment_PDU::operator == ( const Comment_PDU & Value ) const
{
    if( Simulation_Management_Header::operator  !=( Value ) )                     return false;
    if( m_ui32NumFixedDatum                     != Value.m_ui32NumFixedDatum )    return false;
    if( m_ui32NumVariableDatum                  != Value.m_ui32NumVariableDatum ) return false;
    if( m_vFixedDatum                           != Value.m_vFixedDatum )          return false;
    if( m_vVariableDatum                        != Value.m_vVariableDatum )       return false;
    return true;
}